

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skins.cpp
# Opt level: O3

bool __thiscall
CSkins::ValidateSkinParts
          (CSkins *this,char **apPartNames,int *pUseCustomColors,int *pPartColors,int GameFlags)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  float fVar4;
  anon_union_4_3_4e90b46e_for_vector3_base<float>_1 aVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 aVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  vec3 vVar16;
  vec3 HSL;
  vec3 HSL_00;
  float local_b0;
  float local_ac;
  float local_78;
  float local_68;
  anon_union_4_3_4e90b0cd_for_vector3_base<float>_3 aVar9;
  
  if ((GameFlags & 1U) == 0) {
    uVar1 = *pPartColors;
    uVar2 = pPartColors[5];
    fVar4 = 0.0;
    fVar8 = 0.0;
    if (*pUseCustomColors == 0) {
      aVar10.z = 1.0;
    }
    else {
      fVar4 = (float)(uVar1 >> 0x10 & 0xff) / 255.0;
      fVar8 = (float)(uVar1 >> 8 & 0xff) / 255.0;
      aVar10.z = (float)(uVar1 & 0xff) / 255.0;
    }
    vVar16.field_1.y = fVar8;
    vVar16.field_0.x = fVar4;
    vVar16.field_2.z = aVar10.z;
    vVar16 = HslToRgb(vVar16);
    aVar10 = vVar16.field_2;
    aVar5 = vVar16.field_0;
    aVar9 = vVar16.field_1;
    fVar8 = aVar10.z * 0.0721856 + aVar5.x * 0.212656 + aVar9.y * 0.715158;
    if (fVar8 <= 0.008856) {
      local_ac = fVar8 * 7.787 + 0.137931;
    }
    else {
      local_ac = powf(fVar8,0.333333);
    }
    fVar4 = (aVar10.z * 0.180464 + aVar5.x * 0.412424 + aVar9.y * 0.357579) / 0.950467;
    if (fVar4 <= 0.008856) {
      fVar4 = fVar4 * 7.787 + 0.137931;
    }
    else {
      fVar4 = powf(fVar4,0.333333);
    }
    if (fVar8 <= 0.008856) {
      fVar8 = fVar8 * 7.787 + 0.137931;
      local_68 = fVar8;
    }
    else {
      local_68 = powf(fVar8,0.333333);
      fVar8 = powf(fVar8,0.333333);
    }
    fVar15 = (float)(uVar2 >> 0x10 & 0xff) / 255.0;
    fVar12 = (aVar10.z * 0.950444 + aVar5.x * 0.0193324 + aVar9.y * 0.119193) / 1.088969;
    fVar14 = (float)(uVar2 >> 8 & 0xff) / 255.0;
    if (fVar12 <= 0.008856) {
      fVar12 = fVar12 * 7.787 + 0.137931;
    }
    else {
      fVar12 = powf(fVar12,0.333333);
    }
    fVar11 = (float)(uVar2 & 0xff) / 255.0;
    fVar6 = (fVar4 - local_68) * 500.0;
    fVar4 = local_ac * 116.0 + -16.0;
    fVar8 = (fVar8 - fVar12) * 200.0;
    iVar3 = str_comp(apPartNames[5],"negative");
    if (iVar3 == 0) {
      fVar12 = fVar14;
      fVar7 = fVar15;
      if (pUseCustomColors[5] == 0) {
        fVar11 = 1.0;
        fVar12 = 0.0;
        fVar7 = 0.0;
      }
      HSL_00.field_2.z = fVar11 * 0.925;
      HSL_00.field_1.y = fVar12;
      HSL_00.field_0.x = fVar7;
      vVar16 = HslToRgb(HSL_00);
      aVar10 = vVar16.field_2;
      aVar5 = vVar16.field_0;
      aVar9 = vVar16.field_1;
      fVar14 = aVar10.z * 0.0721856 + aVar5.x * 0.212656 + aVar9.y * 0.715158;
      if (fVar14 <= 0.008856) {
        local_b0 = fVar14 * 7.787 + 0.137931;
      }
      else {
        local_b0 = powf(fVar14,0.333333);
      }
      fVar15 = (aVar10.z * 0.180464 + aVar5.x * 0.412424 + aVar9.y * 0.357579) / 0.950467;
      if (fVar15 <= 0.008856) {
        fVar15 = fVar15 * 7.787 + 0.137931;
      }
      else {
        fVar15 = powf(fVar15,0.333333);
      }
      if (fVar14 <= 0.008856) {
        fVar14 = fVar14 * 7.787 + 0.137931;
        local_78 = fVar14;
      }
      else {
        local_78 = powf(fVar14,0.333333);
        fVar14 = powf(fVar14,0.333333);
      }
      fVar13 = (aVar10.z * 0.950444 + aVar5.x * 0.0193324 + aVar9.y * 0.119193) / 1.088969;
      if (fVar13 <= 0.008856) {
        fVar13 = fVar13 * 7.787 + 0.137931;
      }
      else {
        fVar13 = powf(fVar13,0.333333);
      }
      fVar4 = fVar4 - (local_b0 * 116.0 + -16.0);
      fVar6 = fVar6 + (fVar15 - local_78) * -500.0;
      fVar8 = fVar8 + (fVar14 - fVar13) * -200.0;
      if (80.0 <= SQRT(fVar8 * fVar8 + fVar4 * fVar4 + fVar6 * fVar6)) {
        return true;
      }
      fVar11 = fVar11 + -0.22;
      fVar8 = 1.0;
      if (fVar11 <= 1.0) {
        fVar8 = fVar11;
      }
      fVar8 = (float)(~-(uint)(fVar11 < 0.0) & (uint)fVar8);
      if (fVar8 < 0.23921569) goto LAB_0017af8b;
      pUseCustomColors[5] = 1;
      fVar8 = fVar8 * 255.0;
    }
    else {
      iVar3 = str_comp(apPartNames[5],"colorable");
      if (iVar3 != 0) {
        return true;
      }
      fVar7 = 0.0;
      fVar12 = 0.0;
      if (pUseCustomColors[5] != 0) {
        fVar7 = fVar15;
        fVar12 = fVar14;
      }
      fVar14 = 1.0;
      if (pUseCustomColors[5] != 0) {
        fVar14 = fVar11;
      }
      aVar10.z = 1.0;
      if (fVar14 * 0.0823 <= 1.0) {
        aVar10.z = fVar14 * 0.0823;
      }
      HSL.field_1.y = fVar12;
      HSL.field_0.x = fVar7;
      HSL.field_2.z = aVar10.z;
      vVar16 = HslToRgb(HSL);
      aVar10 = vVar16.field_2;
      aVar5 = vVar16.field_0;
      aVar9 = vVar16.field_1;
      fVar15 = aVar10.z * 0.0721856 + aVar5.x * 0.212656 + aVar9.y * 0.715158;
      if (fVar15 <= 0.008856) {
        local_b0 = fVar15 * 7.787 + 0.137931;
      }
      else {
        local_b0 = powf(fVar15,0.333333);
      }
      fVar11 = (aVar10.z * 0.180464 + aVar5.x * 0.412424 + aVar9.y * 0.357579) / 0.950467;
      if (fVar11 <= 0.008856) {
        fVar11 = fVar11 * 7.787 + 0.137931;
      }
      else {
        fVar11 = powf(fVar11,0.333333);
      }
      if (fVar15 <= 0.008856) {
        fVar15 = fVar15 * 7.787 + 0.137931;
        local_78 = fVar15;
      }
      else {
        local_78 = powf(fVar15,0.333333);
        fVar15 = powf(fVar15,0.333333);
      }
      fVar13 = (aVar10.z * 0.950444 + aVar5.x * 0.0193324 + aVar9.y * 0.119193) / 1.088969;
      if (fVar13 <= 0.008856) {
        fVar13 = fVar13 * 7.787 + 0.137931;
      }
      else {
        fVar13 = powf(fVar13,0.333333);
      }
      fVar4 = fVar4 - (local_b0 * 116.0 + -16.0);
      fVar6 = fVar6 + (fVar11 - local_78) * -500.0;
      fVar8 = fVar8 + (fVar15 - fVar13) * -200.0;
      if (80.0 <= SQRT(fVar8 * fVar8 + fVar4 * fVar4 + fVar6 * fVar6)) {
        return true;
      }
      fVar14 = fVar14 + -0.6;
      fVar8 = 1.0;
      if (fVar14 <= 1.0) {
        fVar8 = fVar14;
      }
      pUseCustomColors[5] = 1;
      fVar8 = (float)(~-(uint)(fVar14 < 0.0) & (uint)(fVar8 * 255.0));
    }
    pPartColors[5] = (int)fVar8 | (int)(fVar12 * 255.0) << 8 | (int)(fVar7 * 255.0) << 0x10;
  }
  else {
    iVar3 = str_comp(apPartNames[5],"colorable");
    if ((iVar3 != 0) && (iVar3 = str_comp(apPartNames[5],"negative"), iVar3 != 0)) {
      return true;
    }
LAB_0017af8b:
    str_copy(apPartNames[5],"standard",0x61);
  }
  return false;
}

Assistant:

bool CSkins::ValidateSkinParts(char *apPartNames[NUM_SKINPARTS], int *pUseCustomColors, int *pPartColors, int GameFlags) const
{
	// force standard (black) eyes on team skins
	if(GameFlags&GAMEFLAG_TEAMS)
	{
		// TODO: adjust eye color here as well?
		if(str_comp(apPartNames[SKINPART_EYES], "colorable") == 0 || str_comp(apPartNames[SKINPART_EYES], "negative") == 0)
		{
			str_copy(apPartNames[SKINPART_EYES], "standard", MAX_SKIN_ARRAY_SIZE);
			return false;
		}
	}
	else
	{
		const int BodyColor = pPartColors[SKINPART_BODY];
		const int EyeColor = pPartColors[SKINPART_EYES];

		vec3 BodyHsl(((BodyColor>>16)&0xff)/255.0f, ((BodyColor>>8)&0xff)/255.0f, (BodyColor&0xff)/255.0f);
		vec3 EyeHsl(((EyeColor>>16)&0xff)/255.0f, ((EyeColor>>8)&0xff)/255.0f, (EyeColor&0xff)/255.0f);

		if(!pUseCustomColors[SKINPART_BODY])
			BodyHsl = vec3(0, 0, 1);

		const vec3 BodyLab = RgbToLab(HslToRgb(BodyHsl));

		if(str_comp(apPartNames[SKINPART_EYES], "negative") == 0)
		{
			if(!pUseCustomColors[SKINPART_EYES])
				EyeHsl = vec3(0, 0, 1);

			vec3 OrgEyeHsl = EyeHsl;
			EyeHsl.l *= 0.925f;

			const vec3 EyeLab = RgbToLab(HslToRgb(EyeHsl));
			if(distance(BodyLab, EyeLab) < MIN_EYE_BODY_COLOR_DIST)
			{
				OrgEyeHsl.l = clamp(OrgEyeHsl.l - 0.22f, 0.f, 1.f);

				// white eye can't go to black because of our DARKEST_COLOR_LGT restriction, so switch to standard (black) eyes
				if(OrgEyeHsl.l < DARKEST_COLOR_LGT/255.f)
					str_copy(apPartNames[SKINPART_EYES], "standard", MAX_SKIN_ARRAY_SIZE); // black
				else
				{
					pUseCustomColors[SKINPART_EYES] = 1;
					pPartColors[SKINPART_EYES] = (int(OrgEyeHsl.h*255) << 16) | (int(OrgEyeHsl.s*255) << 8) | (int(OrgEyeHsl.l*255));
				}

				return false;
			}
		}
		else if(str_comp(apPartNames[SKINPART_EYES], "colorable") == 0)
		{
			if(!pUseCustomColors[SKINPART_EYES])
				EyeHsl = vec3(0, 0, 1);

			vec3 OrgEyeHsl = EyeHsl;
			EyeHsl.l = clamp(EyeHsl.l * 0.0823f, 0.f, 1.f);

			const vec3 EyeLab = RgbToLab(HslToRgb(EyeHsl));
			if(distance(BodyLab, EyeLab) < MIN_EYE_BODY_COLOR_DIST)
			{
				OrgEyeHsl.l -= 0.6f;
				OrgEyeHsl.l = clamp(OrgEyeHsl.l, 0.f, 1.f);

				pUseCustomColors[SKINPART_EYES] = 1;
				pPartColors[SKINPART_EYES] = (int(OrgEyeHsl.h*255) << 16) | (int(OrgEyeHsl.s*255) << 8) | (int(OrgEyeHsl.l*255));

				return false;
			}
		}
	}

	return true;
}